

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void __thiscall
soplex::SPxWeightST<double>::setupWeights(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  int iVar1;
  Representation RVar2;
  Type TVar3;
  int iVar4;
  double *pdVar5;
  SVectorBase<double> *pSVar6;
  bool *pbVar7;
  SPxSolverBase<double> *in_RSI;
  long in_RDI;
  double dVar8;
  Real RVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Real RVar16;
  double dVar17;
  double x_2;
  double l_3;
  double u_3;
  double n_2;
  double len1;
  double l_2;
  double u_2;
  double x_1;
  double n_1;
  double r_free_1;
  double c_free_1;
  double r_bounded_1;
  double c_bounded_1;
  double r_dbl_bounded_1;
  double c_dbl_bounded_1;
  double r_fixed_1;
  double c_fixed_1;
  double nne_1;
  double bx_1;
  double ax_1;
  double l_1;
  double u_1;
  double l;
  double u;
  double x;
  double n;
  double r_free;
  double c_free;
  double r_bounded;
  double c_bounded;
  double r_dbl_bounded;
  double c_dbl_bounded;
  double r_fixed;
  double c_fixed;
  double nne;
  double bx;
  double ax;
  double maxabs;
  double eps;
  int i;
  VectorBase<double> *lhs;
  VectorBase<double> *rhs;
  VectorBase<double> *up;
  VectorBase<double> *low;
  VectorBase<double> *obj;
  int in_stack_fffffffffffffc4c;
  SPxLPBase<double> *in_stack_fffffffffffffc50;
  SVectorBase<double> *in_stack_fffffffffffffc68;
  VectorBase<double> *in_stack_fffffffffffffc70;
  VectorBase<double> *in_stack_fffffffffffffc80;
  double local_50;
  int local_3c;
  
  SPxLPBase<double>::maxObj((SPxLPBase<double> *)0x2da454);
  SPxLPBase<double>::lower((SPxLPBase<double> *)0x2da469);
  SPxLPBase<double>::upper((SPxLPBase<double> *)0x2da47e);
  SPxLPBase<double>::rhs((SPxLPBase<double> *)0x2da493);
  SPxLPBase<double>::lhs((SPxLPBase<double> *)0x2da4a8);
  dVar8 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2da4bd);
  local_50 = 1.0;
  for (local_3c = 0; iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2da4fd),
      local_3c < iVar1; local_3c = local_3c + 1) {
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    dVar10 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (dVar10 < *pdVar5) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      RVar9 = spxAbs<double>(*pdVar5);
      if (local_50 < RVar9) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        local_50 = spxAbs<double>(*pdVar5);
      }
    }
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    dVar10 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar10) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      RVar9 = spxAbs<double>(*pdVar5);
      if (local_50 < RVar9) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        local_50 = spxAbs<double>(*pdVar5);
      }
    }
  }
  for (local_3c = 0; iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2da671),
      local_3c < iVar1; local_3c = local_3c + 1) {
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    dVar10 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (dVar10 < *pdVar5) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      RVar9 = spxAbs<double>(*pdVar5);
      if (local_50 < RVar9) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        local_50 = spxAbs<double>(*pdVar5);
      }
    }
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
    dVar10 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar10) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      RVar9 = spxAbs<double>(*pdVar5);
      if (local_50 < RVar9) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        local_50 = spxAbs<double>(*pdVar5);
      }
    }
  }
  RVar2 = SPxSolverBase<double>::rep(in_RSI);
  TVar3 = SPxSolverBase<double>::type(in_RSI);
  if (RVar2 * TVar3 < 1) {
    dVar10 = VectorBase<double>::maxAbs(in_stack_fffffffffffffc80);
    dVar11 = 0.01 / local_50;
    local_3c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2db33f);
    while (local_3c = local_3c + -1, -1 < local_3c) {
      pSVar6 = SPxLPBase<double>::colVector(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      iVar1 = SVectorBase<double>::size(pSVar6);
      dVar14 = dVar11 * 0.0001 * (double)(iVar1 + -1);
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar15 = (1.0 / dVar10) * *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar17 = *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar12 = *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar13 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= dVar13) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar17 = *pdVar5;
        pdVar5 = (double *)infinity();
        if (dVar17 <= -*pdVar5) {
          RVar9 = spxAbs<double>(dVar15);
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = (dVar14 + -10000.0) - RVar9;
        }
        else {
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = (0.0 - dVar15) + dVar11 * dVar12 + dVar14;
          pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
          *pbVar7 = false;
        }
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar13 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        RVar9 = spxAbs<double>(dVar13 - *pdVar5);
        if (dVar8 <= RVar9) {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffc50,
                              in_stack_fffffffffffffc4c);
          dVar13 = *pdVar5;
          pdVar5 = (double *)infinity();
          if (dVar13 <= -*pdVar5) {
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = (0.0 - dVar11 * dVar17) + dVar15 + dVar14;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
            *pbVar7 = true;
          }
          else if (dVar15 <= 0.0) {
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = (1.0 - dVar15) + dVar11 * dVar12 + dVar14;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
            *pbVar7 = false;
          }
          else {
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = ((dVar15 + 1.0) - dVar11 * dVar17) + dVar14;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
            *pbVar7 = true;
          }
        }
        else {
          RVar9 = spxAbs<double>(dVar15);
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = dVar14 + 100000.0 + RVar9;
        }
      }
    }
    local_3c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2db859);
    while (local_3c = local_3c + -1, -1 < local_3c) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar12 = dVar11 * 1.0 * *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar13 = dVar11 * 1.0 * *pdVar5;
      SPxLPBase<double>::rowVector(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      dVar14 = VectorBase<double>::operator*(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      dVar14 = (1.0 / dVar10) * 1.0 * dVar14;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar17 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= dVar17) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        in_stack_fffffffffffffc68 = (SVectorBase<double> *)*pdVar5;
        pdVar5 = (double *)infinity();
        if ((double)in_stack_fffffffffffffc68 <= -*pdVar5) {
          in_stack_fffffffffffffc50 = (SPxLPBase<double> *)0xc0f86a0000000000;
          RVar9 = spxAbs<double>(dVar14);
          dVar17 = (double)in_stack_fffffffffffffc50 - RVar9;
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = dVar17;
        }
        else {
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = (dVar13 + 0.0 + 0.0) - dVar14;
          pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
          *pbVar7 = false;
        }
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar17 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        RVar9 = spxAbs<double>(dVar17 - *pdVar5);
        if (dVar8 <= RVar9) {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffc50,
                              in_stack_fffffffffffffc4c);
          dVar17 = *pdVar5;
          pdVar5 = (double *)infinity();
          if (dVar17 <= -*pdVar5) {
            in_stack_fffffffffffffc70 = (VectorBase<double> *)((0.0 - dVar12) + 0.0 + dVar14);
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = (double)in_stack_fffffffffffffc70;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
            *pbVar7 = true;
          }
          else if (dVar14 <= 0.0) {
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = (0.0 - dVar14) + dVar13 + 0.0;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
            *pbVar7 = false;
          }
          else {
            dVar17 = ((dVar14 + 0.0) - dVar12) + 0.0;
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = dVar17;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
            *pbVar7 = true;
          }
        }
        else {
          RVar9 = spxAbs<double>(dVar14);
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = RVar9 + 10000.0;
        }
      }
    }
  }
  else {
    dVar10 = VectorBase<double>::maxAbs(in_stack_fffffffffffffc80);
    dVar11 = 1.0 / local_50;
    iVar1 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2da853);
    local_3c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2da8f3);
    while (local_3c = local_3c + -1, -1 < local_3c) {
      pSVar6 = SPxLPBase<double>::colVector(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
      iVar4 = SVectorBase<double>::size(pSVar6);
      dVar12 = ((0.001 / dVar10) / (double)iVar1) * (double)(iVar4 + -1);
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar13 = (0.001 / dVar10) * *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar14 = dVar11 * *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar15 = dVar11 * *pdVar5;
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar17 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= dVar17) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar17 = *pdVar5;
        pdVar5 = (double *)infinity();
        if (dVar17 <= -*pdVar5) {
          RVar9 = spxAbs<double>(dVar13);
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = (dVar12 + -10000.0) - RVar9;
        }
        else {
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = (dVar15 + 10.0 + dVar12) - dVar13;
          pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
          *pbVar7 = false;
        }
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar17 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        RVar9 = spxAbs<double>(dVar17 - *pdVar5);
        if (dVar8 <= RVar9) {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffc50,
                              in_stack_fffffffffffffc4c);
          dVar17 = *pdVar5;
          pdVar5 = (double *)infinity();
          if (dVar17 <= -*pdVar5) {
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = (10.0 - dVar14) + dVar13 + dVar12;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
            *pbVar7 = true;
          }
          else {
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = ((dVar15 + 10.0) - dVar14) + dVar12;
            RVar9 = spxAbs<double>(dVar15);
            RVar16 = spxAbs<double>(dVar14);
            if (RVar9 <= RVar16) {
              pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
              *pbVar7 = false;
              pdVar5 = Array<double>::operator[]
                                 ((Array<double> *)in_stack_fffffffffffffc50,
                                  in_stack_fffffffffffffc4c);
              *pdVar5 = *pdVar5 - dVar13;
            }
            else {
              pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x90),local_3c);
              *pbVar7 = true;
              pdVar5 = Array<double>::operator[]
                                 ((Array<double> *)in_stack_fffffffffffffc50,
                                  in_stack_fffffffffffffc4c);
              *pdVar5 = dVar13 + *pdVar5;
            }
          }
        }
        else {
          RVar9 = spxAbs<double>(dVar13);
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = dVar12 + 100000.0 + RVar9;
        }
      }
    }
    local_3c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2dae74);
    while (local_3c = local_3c + -1, -1 < local_3c) {
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c)
      ;
      dVar10 = *pdVar5;
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= dVar10) {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar10 = *pdVar5;
        pdVar5 = (double *)infinity();
        if (dVar10 <= -*pdVar5) {
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = -100000.0;
        }
        else {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffc50,
                              in_stack_fffffffffffffc4c);
          dVar10 = *pdVar5;
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = dVar11 * dVar10 + 0.0;
          pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
          *pbVar7 = false;
        }
      }
      else {
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        dVar10 = *pdVar5;
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc4c);
        RVar9 = spxAbs<double>(dVar10 - *pdVar5);
        if (dVar8 <= RVar9) {
          pdVar5 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffc50,
                              in_stack_fffffffffffffc4c);
          dVar10 = *pdVar5;
          pdVar5 = (double *)infinity();
          if (dVar10 <= -*pdVar5) {
            pdVar5 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffc50,
                                in_stack_fffffffffffffc4c);
            dVar10 = *pdVar5;
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = 0.0 - dVar11 * dVar10;
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
            *pbVar7 = true;
          }
          else {
            pdVar5 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffc50,
                                in_stack_fffffffffffffc4c);
            dVar10 = *pdVar5;
            pdVar5 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffc50,
                                in_stack_fffffffffffffc4c);
            dVar17 = *pdVar5;
            pdVar5 = Array<double>::operator[]
                               ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                               );
            *pdVar5 = (dVar11 * dVar17 + 0.0) - dVar11 * dVar10;
            RVar9 = spxAbs<double>(dVar11 * dVar10);
            RVar16 = spxAbs<double>(dVar11 * dVar17);
            pbVar7 = DataArray<bool>::operator[]((DataArray<bool> *)(in_RDI + 0x78),local_3c);
            *pbVar7 = RVar9 < RVar16;
          }
        }
        else {
          pdVar5 = Array<double>::operator[]
                             ((Array<double> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          *pdVar5 = 0.0;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}